

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O0

void test_cio_write_buffer_splice(void)

{
  _Bool _Var1;
  size_t sVar2;
  cio_write_buffer *pcVar3;
  cio_write_buffer *dequeued_wb;
  cio_write_buffer wb2_two;
  cio_write_buffer wb1_two;
  cio_write_buffer wbh_two;
  size_t num_elements;
  cio_write_buffer wb2_one;
  char cStack_58;
  char cStack_57;
  char cStack_56;
  char data2 [13];
  cio_write_buffer wb1_one;
  undefined1 local_28 [4];
  uint data1;
  cio_write_buffer wbh_one;
  
  cio_write_buffer_head_init((cio_write_buffer *)local_28);
  wb1_one.data.element.length._4_4_ = 0x12;
  cio_write_buffer_element_init
            ((cio_write_buffer *)(data2 + 5),(void *)((long)&wb1_one.data + 0xc),4);
  cio_write_buffer_queue_tail((cio_write_buffer *)local_28,(cio_write_buffer *)(data2 + 5));
  wb2_one.data._11_1_ = 'H';
  wb2_one.data._12_1_ = 'e';
  wb2_one.data._13_1_ = 'l';
  wb2_one.data._14_1_ = 'l';
  wb2_one.data._15_1_ = 'o';
  cStack_58 = ' ';
  cStack_57 = 'W';
  cStack_56 = 'o';
  builtin_strncpy(data2,"rld!",5);
  cio_write_buffer_const_element_init
            ((cio_write_buffer *)&num_elements,(void *)((long)&wb2_one.data + 0xb),0xd);
  cio_write_buffer_queue_tail((cio_write_buffer *)local_28,(cio_write_buffer *)&num_elements);
  sVar2 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)local_28);
  UnityAssertEqualNumber
            (2,sVar2,"Number of elements in write buffer not \'2\' after inserting second element!",
             0xdf,UNITY_DISPLAY_STYLE_INT);
  sVar2 = cio_write_buffer_get_total_size((cio_write_buffer *)local_28);
  UnityAssertEqualNumber
            (0x11,sVar2,"Write buffer total length not correct!",0xe0,UNITY_DISPLAY_STYLE_INT);
  cio_write_buffer_head_init((cio_write_buffer *)((long)&wb1_two.data + 8));
  cio_write_buffer_element_init
            ((cio_write_buffer *)((long)&wb2_two.data + 8),(void *)((long)&wb1_one.data + 0xc),4);
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)((long)&wb1_two.data + 8),
             (cio_write_buffer *)((long)&wb2_two.data + 8));
  cio_write_buffer_const_element_init
            ((cio_write_buffer *)&dequeued_wb,(void *)((long)&wb2_one.data + 0xb),0xd);
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)((long)&wb1_two.data + 8),(cio_write_buffer *)&dequeued_wb);
  sVar2 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)((long)&wb1_two.data + 8));
  UnityAssertEqualNumber
            (2,sVar2,"Number of elements in write buffer not \'2\' after inserting second element!",
             0xed,UNITY_DISPLAY_STYLE_INT);
  sVar2 = cio_write_buffer_get_total_size((cio_write_buffer *)((long)&wb1_two.data + 8));
  UnityAssertEqualNumber
            (0x11,sVar2,"Write buffer total length not correct!",0xee,UNITY_DISPLAY_STYLE_INT);
  cio_write_buffer_splice
            ((cio_write_buffer *)((long)&wb1_two.data + 8),(cio_write_buffer *)local_28);
  sVar2 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)((long)&wb1_two.data + 8));
  UnityAssertEqualNumber
            (0,sVar2,
             "Number of elements in write buffer two not \'0\' after splicing to another list!",0xf2
             ,UNITY_DISPLAY_STYLE_INT);
  _Var1 = cio_write_buffer_queue_empty((cio_write_buffer *)((long)&wb1_two.data + 8));
  if (!_Var1) {
    UnityFail("Write buffer not empty after splicing!",0xf3);
  }
  sVar2 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)local_28);
  UnityAssertEqualNumber
            (4,sVar2,
             "Number of elements in write buffer two not \'4\' after splicing from another list!",
             0xf5,UNITY_DISPLAY_STYLE_INT);
  sVar2 = cio_write_buffer_get_total_size((cio_write_buffer *)local_28);
  UnityAssertEqualNumber
            (0x22,sVar2,"Write buffer total length not correct!",0xf6,UNITY_DISPLAY_STYLE_INT);
  sVar2 = cio_write_buffer_get_total_size((cio_write_buffer *)((long)&wb1_two.data + 8));
  UnityAssertEqualNumber
            (0,sVar2,"Write buffer total length not correct!",0xf7,UNITY_DISPLAY_STYLE_INT);
  pcVar3 = cio_write_buffer_queue_dequeue((cio_write_buffer *)local_28);
  UnityAssertEqualNumber
            ((UNITY_INT)(data2 + 5),(UNITY_INT)pcVar3,
             "First dequeued write buffer is not correct after splicing!",0xfa,
             UNITY_DISPLAY_STYLE_INT);
  pcVar3 = cio_write_buffer_queue_dequeue((cio_write_buffer *)local_28);
  UnityAssertEqualNumber
            ((UNITY_INT)&num_elements,(UNITY_INT)pcVar3,
             "Second dequeued write buffer is not correct after splicing!",0xfc,
             UNITY_DISPLAY_STYLE_INT);
  pcVar3 = cio_write_buffer_queue_dequeue((cio_write_buffer *)local_28);
  UnityAssertEqualNumber
            ((UNITY_INT)((long)&wb2_two.data + 8),(UNITY_INT)pcVar3,
             "Third dequeued write buffer is not correct after splicing!",0xfe,
             UNITY_DISPLAY_STYLE_INT);
  pcVar3 = cio_write_buffer_queue_dequeue((cio_write_buffer *)local_28);
  UnityAssertEqualNumber
            ((UNITY_INT)&dequeued_wb,(UNITY_INT)pcVar3,
             "Forth dequeued write buffer is not correct after splicing!",0x100,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_write_buffer_splice(void)
{
	struct cio_write_buffer wbh_one;
	cio_write_buffer_head_init(&wbh_one);

	unsigned int data1 = 0x12;
	struct cio_write_buffer wb1_one;
	cio_write_buffer_element_init(&wb1_one, &data1, sizeof(data1));
	cio_write_buffer_queue_tail(&wbh_one, &wb1_one);

	const char data2[] = "Hello World!";
	struct cio_write_buffer wb2_one;
	cio_write_buffer_const_element_init(&wb2_one, data2, sizeof(data2));
	cio_write_buffer_queue_tail(&wbh_one, &wb2_one);
	size_t num_elements = cio_write_buffer_get_num_buffer_elements(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements in write buffer not '2' after inserting second element!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh_one), "Write buffer total length not correct!");

	struct cio_write_buffer wbh_two;
	cio_write_buffer_head_init(&wbh_two);

	struct cio_write_buffer wb1_two;
	cio_write_buffer_element_init(&wb1_two, &data1, sizeof(data1));
	cio_write_buffer_queue_tail(&wbh_two, &wb1_two);

	struct cio_write_buffer wb2_two;
	cio_write_buffer_const_element_init(&wb2_two, data2, sizeof(data2));
	cio_write_buffer_queue_tail(&wbh_two, &wb2_two);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh_two);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements in write buffer not '2' after inserting second element!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh_two), "Write buffer total length not correct!");

	cio_write_buffer_splice(&wbh_two, &wbh_one);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh_two);
	TEST_ASSERT_EQUAL_MESSAGE(0, num_elements, "Number of elements in write buffer two not '0' after splicing to another list!");
	TEST_ASSERT_TRUE_MESSAGE(cio_write_buffer_queue_empty(&wbh_two), "Write buffer not empty after splicing!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(4, num_elements, "Number of elements in write buffer two not '4' after splicing from another list!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2) + sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh_one), "Write buffer total length not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_write_buffer_get_total_size(&wbh_two), "Write buffer total length not correct!");

	struct cio_write_buffer *dequeued_wb = cio_write_buffer_queue_dequeue(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(&wb1_one, dequeued_wb, "First dequeued write buffer is not correct after splicing!");
	dequeued_wb = cio_write_buffer_queue_dequeue(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(&wb2_one, dequeued_wb, "Second dequeued write buffer is not correct after splicing!");
	dequeued_wb = cio_write_buffer_queue_dequeue(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(&wb1_two, dequeued_wb, "Third dequeued write buffer is not correct after splicing!");
	dequeued_wb = cio_write_buffer_queue_dequeue(&wbh_one);
	TEST_ASSERT_EQUAL_MESSAGE(&wb2_two, dequeued_wb, "Forth dequeued write buffer is not correct after splicing!");
}